

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O3

void __thiscall
bsplib::A2A::A2A(A2A *this,MPI_Comm comm,size_t max_msg_size,size_t small_a2a_size_per_proc,
                double alpha,double beta,Method method)

{
  int *piVar1;
  MPI_Comm *ppoVar2;
  ulong uVar3;
  value_type local_38;
  
  this->m_method = method;
  this->m_pid = 0;
  this->m_nprocs = 0;
  this->m_max_msg_size = max_msg_size;
  this->m_small_a2a_size_per_proc = small_a2a_size_per_proc;
  this->m_send_cap = 0;
  this->m_recv_cap = 0;
  LinCost::LinCost(&this->m_lincost,alpha,beta);
  ppoVar2 = &this->m_comm;
  memset(&this->m_send_sizes,0,0xc0);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  this->m_recv_win = (MPI_Win)&ompi_mpi_win_null;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MPI_Comm_dup(comm,ppoVar2);
  MPI_Comm_rank(*ppoVar2,&this->m_pid);
  piVar1 = &this->m_nprocs;
  MPI_Comm_size(*ppoVar2,piVar1);
  uVar3 = (ulong)(int)(0x7fffffff / (long)this->m_nprocs);
  if (this->m_small_a2a_size_per_proc < uVar3) {
    uVar3 = this->m_small_a2a_size_per_proc;
  }
  this->m_small_a2a_size_per_proc = uVar3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_send_sizes,(long)this->m_nprocs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_send_pos,(long)*piVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_recv_sizes,(long)*piVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_recv_pos,(long)*piVar1);
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_small_send_buf,(long)*piVar1 * small_a2a_size_per_proc);
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_small_recv_buf,(long)*piVar1 * small_a2a_size_per_proc);
  if (this->m_method == MSG) {
    local_38 = (value_type)&ompi_request_null;
    std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
              (&this->m_reqs,(long)*piVar1 * 2,&local_38);
    std::vector<int,_std::allocator<int>_>::resize(&this->m_ready,(long)*piVar1 * 2);
  }
  return;
}

Assistant:

A2A::A2A( MPI_Comm comm,
        std::size_t max_msg_size, std::size_t small_a2a_size_per_proc,
        double alpha, double beta,
        Method method )
    : m_method( method )
    , m_pid( )
    , m_nprocs( )
    , m_max_msg_size( max_msg_size )
    , m_small_a2a_size_per_proc( small_a2a_size_per_proc )
    , m_send_cap(0)
    , m_recv_cap(0)
    , m_lincost( alpha, beta )
    , m_send_sizes()
    , m_send_pos()
    , m_send_bufs()
    , m_recv_sizes()
    , m_recv_pos()
    , m_recv_bufs()
    , m_small_send_buf()
    , m_small_recv_buf()
    , m_comm( MPI_COMM_NULL )
    , m_recv_win(MPI_WIN_NULL)
    , m_reqs()
    , m_ready()
{ 
    MPI_Comm_dup( comm, &m_comm );
    MPI_Comm_rank(m_comm, &m_pid );
    MPI_Comm_size(m_comm, &m_nprocs );

    m_small_a2a_size_per_proc = std::min<size_t>( m_small_a2a_size_per_proc,
            std::numeric_limits<int>::max()/m_nprocs );

    m_send_sizes.resize( m_nprocs );
    m_send_pos.resize( m_nprocs );
    m_recv_sizes.resize( m_nprocs );
    m_recv_pos.resize( m_nprocs );
    m_small_send_buf.resize( small_a2a_size_per_proc * m_nprocs );
    m_small_recv_buf.resize( small_a2a_size_per_proc * m_nprocs );

    if (m_method == MSG) {
        m_reqs.resize( 2*m_nprocs, MPI_REQUEST_NULL );
        m_ready.resize( 2*m_nprocs );
    }
}